

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

handle_model_result *
common_params_handle_model
          (common_params_model *model,string *bearer_token,string *model_path_default)

{
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  common_log *log;
  undefined8 uVar4;
  string *in_RCX;
  string *in_RSI;
  handle_model_result *in_RDI;
  bool ok;
  value_type f;
  string *in_stack_00000110;
  string *in_stack_00000118;
  string filename;
  string model_endpoint;
  common_hf_file_res auto_detected;
  handle_model_result *result;
  string *in_stack_00002ef0;
  common_params_model *in_stack_00002ef8;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  handle_model_result *__rhs;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  allocator<char> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  char in_stack_fffffffffffffde7;
  string *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf8;
  string local_1e8 [32];
  string local_1c8 [8];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  string local_48 [39];
  undefined1 local_21;
  string *local_20;
  string *local_10;
  
  local_21 = 0;
  __rhs = in_RDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  handle_model_result::handle_model_result((handle_model_result *)0x2ea231);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator=(local_10 + 0x60,local_10);
      }
      else {
        common_get_hf_file(in_stack_00000118,in_stack_00000110);
        uVar2 = std::__cxx11::string::empty();
        if (((uVar2 & 1) != 0) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
          exit(1);
        }
        std::__cxx11::string::operator=(local_10 + 0x40,local_88);
        std::__cxx11::string::operator=(local_10 + 0x60,local_68);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          in_RDI->found_mmproj = true;
          std::__cxx11::string::operator=((string *)&(in_RDI->mmproj).hf_repo,local_10 + 0x40);
          std::__cxx11::string::operator=((string *)&(in_RDI->mmproj).hf_file,local_48);
        }
        common_hf_file_res::~common_hf_file_res
                  ((common_hf_file_res *)
                   CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      }
    }
    get_model_endpoint_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(in_stack_fffffffffffffd88,
                   (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    std::operator+(in_stack_fffffffffffffd88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    std::__cxx11::string::operator=(local_10 + 0x20,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                     &__rhs->found_mmproj);
      std::operator+(in_stack_fffffffffffffd88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      string_replace_all(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator(&local_179);
      fs_get_cache_file(in_stack_fffffffffffffdf8);
      std::__cxx11::string::operator=(local_10,local_1c8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_138);
    }
    std::__cxx11::string::~string(local_b8);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        string_split<std::__cxx11::string>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde7);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        std::__cxx11::string::string(local_1e8,(string *)pvVar3);
        httplib::detail::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffd90);
        string_split<std::__cxx11::string>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde7);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        std::__cxx11::string::operator=(local_1e8,(string *)pvVar3);
        httplib::detail::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffd90);
        string_split<std::__cxx11::string>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde7);
        httplib::detail::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        fs_get_cache_file(in_stack_fffffffffffffdf8);
        std::__cxx11::string::operator=(local_10,(string *)&stack0xfffffffffffffdc8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
        httplib::detail::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffd90);
        std::__cxx11::string::~string(local_1e8);
      }
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::operator=(local_10,local_20);
      }
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (bVar1 = common_download_model(in_stack_00002ef8,in_stack_00002ef0), !bVar1)) {
    if (-1 < common_log_verbosity_thold) {
      log = common_log_main();
      uVar4 = std::__cxx11::string::c_str();
      common_log_add(log,GGML_LOG_LEVEL_ERROR,"error: failed to download model from %s\n",uVar4);
    }
    exit(1);
  }
  return __rhs;
}

Assistant:

static handle_model_result common_params_handle_model(
        struct common_params_model & model,
        const std::string & bearer_token,
        const std::string & model_path_default) {
    handle_model_result result;
    // handle pre-fill default model path and url based on hf_repo and hf_file
    {
        if (!model.hf_repo.empty()) {
            // short-hand to avoid specifying --hf-file -> default it to --model
            if (model.hf_file.empty()) {
                if (model.path.empty()) {
                    auto auto_detected = common_get_hf_file(model.hf_repo, bearer_token);
                    if (auto_detected.repo.empty() || auto_detected.ggufFile.empty()) {
                        exit(1); // built without CURL, error message already printed
                    }
                    model.hf_repo = auto_detected.repo;
                    model.hf_file = auto_detected.ggufFile;
                    if (!auto_detected.mmprojFile.empty()) {
                        result.found_mmproj   = true;
                        result.mmproj.hf_repo = model.hf_repo;
                        result.mmproj.hf_file = auto_detected.mmprojFile;
                    }
                } else {
                    model.hf_file = model.path;
                }
            }

            std::string model_endpoint = get_model_endpoint();
            model.url = model_endpoint + model.hf_repo + "/resolve/main/" + model.hf_file;
            // make sure model path is present (for caching purposes)
            if (model.path.empty()) {
                // this is to avoid different repo having same file name, or same file name in different subdirs
                std::string filename = model.hf_repo + "_" + model.hf_file;
                // to make sure we don't have any slashes in the filename
                string_replace_all(filename, "/", "_");
                model.path = fs_get_cache_file(filename);
            }

        } else if (!model.url.empty()) {
            if (model.path.empty()) {
                auto f = string_split<std::string>(model.url, '#').front();
                f = string_split<std::string>(f, '?').front();
                model.path = fs_get_cache_file(string_split<std::string>(f, '/').back());
            }

        } else if (model.path.empty()) {
            model.path = model_path_default;
        }
    }

    // then, download it if needed
    if (!model.url.empty()) {
        bool ok = common_download_model(model, bearer_token);
        if (!ok) {
            LOG_ERR("error: failed to download model from %s\n", model.url.c_str());
            exit(1);
        }
    }

    return result;
}